

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::Remove(SQVM *this,SQInteger n)

{
  byte *obj;
  long in_RSI;
  SQObjectPtr *in_RDI;
  SQInteger i;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  byte *local_18;
  
  if (in_RSI < 0) {
    obj = (byte *)((long)&((in_RDI[4].super_SQObject._unVal.pTable)->super_SQDelegable).
                          super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + in_RSI);
    local_18 = obj;
  }
  else {
    obj = (byte *)(in_RSI + *(long *)&in_RDI[5].super_SQObject + -1);
    local_18 = obj;
  }
  for (; (long)local_18 < in_RDI[4].super_SQObject._unVal.nInteger; local_18 = local_18 + 1) {
    in_stack_ffffffffffffffd0 =
         sqvector<SQObjectPtr>::operator[]
                   ((sqvector<SQObjectPtr> *)(in_RDI + 3),(SQUnsignedInteger)(local_18 + 1));
    sqvector<SQObjectPtr>::operator[]
              ((sqvector<SQObjectPtr> *)(in_RDI + 3),(SQUnsignedInteger)local_18);
    ::SQObjectPtr::operator=(in_RDI,(SQObjectPtr *)obj);
  }
  sqvector<SQObjectPtr>::operator[]
            ((sqvector<SQObjectPtr> *)(in_RDI + 3),in_RDI[4].super_SQObject._unVal.nInteger);
  ::SQObjectPtr::Null(in_stack_ffffffffffffffd0);
  in_RDI[4].super_SQObject._unVal.pTable =
       (SQTable *)(in_RDI[4].super_SQObject._unVal.nInteger + -1);
  return;
}

Assistant:

void SQVM::Remove(SQInteger n) {
    n = (n >= 0)?n + _stackbase - 1:_top + n;
    for(SQInteger i = n; i < _top; i++){
        _stack[i] = _stack[i+1];
    }
    _stack[_top].Null();
    _top--;
}